

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive *prim;
  ulong uVar17;
  ulong unaff_R14;
  size_t mask;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined4 uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [32];
  undefined1 in_ZMM18 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24a9;
  ulong local_24a8;
  ulong local_24a0;
  ulong local_2498;
  ulong local_2490;
  ulong local_2488;
  ulong *local_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar4 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      auVar20 = vandps_avx512vl((undefined1  [16])aVar2,auVar20);
      auVar36._8_4_ = 0x219392ef;
      auVar36._0_8_ = 0x219392ef219392ef;
      auVar36._12_4_ = 0x219392ef;
      uVar12 = vcmpps_avx512vl(auVar20,auVar36,1);
      bVar3 = (bool)((byte)uVar12 & 1);
      auVar21._0_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.x;
      bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar21._4_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.y;
      bVar3 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar21._8_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * (int)aVar2.z;
      bVar3 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar21._12_4_ = (uint)bVar3 * 0x219392ef | (uint)!bVar3 * aVar2.field_3.a;
      auVar20 = vrcp14ps_avx512vl(auVar21);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = &DAT_3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22 = vfnmadd213ps_avx512vl(auVar21,auVar20,auVar22);
      local_2480 = local_2368;
      auVar21 = vfmadd132ps_fma(auVar22,auVar20,auVar20);
      fVar30 = auVar21._0_4_;
      local_23b8._4_4_ = fVar30;
      local_23b8._0_4_ = fVar30;
      local_23b8._8_4_ = fVar30;
      local_23b8._12_4_ = fVar30;
      local_23b8._16_4_ = fVar30;
      local_23b8._20_4_ = fVar30;
      local_23b8._24_4_ = fVar30;
      local_23b8._28_4_ = fVar30;
      auVar39 = ZEXT3264(local_23b8);
      auVar20 = vmovshdup_avx(auVar21);
      uVar35 = auVar20._0_8_;
      local_23d8._8_8_ = uVar35;
      local_23d8._0_8_ = uVar35;
      local_23d8._16_8_ = uVar35;
      local_23d8._24_8_ = uVar35;
      auVar40 = ZEXT3264(local_23d8);
      auVar22 = vshufpd_avx(auVar21,auVar21,1);
      auVar37._8_4_ = 2;
      auVar37._0_8_ = 0x200000002;
      auVar37._12_4_ = 2;
      auVar37._16_4_ = 2;
      auVar37._20_4_ = 2;
      auVar37._24_4_ = 2;
      auVar37._28_4_ = 2;
      local_23f8 = vpermps_avx2(auVar37,ZEXT1632(auVar21));
      auVar41 = ZEXT3264(local_23f8);
      fVar31 = fVar30 * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar23._8_4_ = 1;
      auVar23._0_8_ = 0x100000001;
      auVar23._12_4_ = 1;
      auVar23._16_4_ = 1;
      auVar23._20_4_ = 1;
      auVar23._24_4_ = 1;
      auVar23._28_4_ = 1;
      auVar32 = ZEXT1632(CONCAT412(auVar21._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar21._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar21._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar31))));
      auVar23 = vpermps_avx2(auVar23,auVar32);
      auVar32 = vpermps_avx2(auVar37,auVar32);
      local_2488 = (ulong)(fVar30 < 0.0) << 5;
      local_2490 = (ulong)(auVar20._0_4_ < 0.0) << 5 | 0x40;
      local_2498 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x80;
      local_24a0 = local_2488 ^ 0x20;
      local_24a8 = local_2490 ^ 0x20;
      uVar17 = local_2498 ^ 0x20;
      uVar34 = auVar5._0_4_;
      auVar33 = ZEXT3264(CONCAT428(uVar34,CONCAT424(uVar34,CONCAT420(uVar34,CONCAT416(uVar34,
                                                  CONCAT412(uVar34,CONCAT48(uVar34,CONCAT44(uVar34,
                                                  uVar34))))))));
      local_2418._0_8_ = CONCAT44(fVar31,fVar31) ^ 0x8000000080000000;
      local_2418._8_4_ = -fVar31;
      local_2418._12_4_ = -fVar31;
      local_2418._16_4_ = -fVar31;
      local_2418._20_4_ = -fVar31;
      local_2418._24_4_ = -fVar31;
      local_2418._28_4_ = -fVar31;
      auVar42 = ZEXT3264(local_2418);
      local_2438._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
      local_2438._8_4_ = auVar23._8_4_ ^ 0x80000000;
      local_2438._12_4_ = auVar23._12_4_ ^ 0x80000000;
      local_2438._16_4_ = auVar23._16_4_ ^ 0x80000000;
      local_2438._20_4_ = auVar23._20_4_ ^ 0x80000000;
      local_2438._24_4_ = auVar23._24_4_ ^ 0x80000000;
      local_2438._28_4_ = auVar23._28_4_ ^ 0x80000000;
      auVar38 = ZEXT3264(local_2438);
      local_2458._0_8_ = auVar32._0_8_ ^ 0x8000000080000000;
      local_2458._8_4_ = auVar32._8_4_ ^ 0x80000000;
      local_2458._12_4_ = auVar32._12_4_ ^ 0x80000000;
      local_2458._16_4_ = auVar32._16_4_ ^ 0x80000000;
      local_2458._20_4_ = auVar32._20_4_ ^ 0x80000000;
      local_2458._24_4_ = auVar32._24_4_ ^ 0x80000000;
      local_2458._28_4_ = auVar32._28_4_ ^ 0x80000000;
      auVar43 = ZEXT3264(local_2458);
      uVar34 = auVar4._0_4_;
      local_2478._4_4_ = uVar34;
      local_2478._0_4_ = uVar34;
      local_2478._8_4_ = uVar34;
      local_2478._12_4_ = uVar34;
      local_2478._16_4_ = uVar34;
      local_2478._20_4_ = uVar34;
      local_2478._24_4_ = uVar34;
      local_2478._28_4_ = uVar34;
      auVar44 = ZEXT3264(local_2478);
      auVar23 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar45 = ZEXT3264(auVar23);
      auVar23 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar46 = ZEXT3264(auVar23);
      uVar12 = local_24a0;
      uVar14 = local_2488;
      uVar15 = local_2490;
      uVar16 = local_2498;
      uVar18 = local_24a8;
      do {
        do {
          if (local_2480 == &local_2378) {
            return;
          }
          pfVar1 = (float *)(local_2480 + -1);
          local_2480 = local_2480 + -2;
        } while ((ray->super_RayK<1>).tfar < *pfVar1);
        uVar19 = *local_2480;
        do {
          auVar37 = auVar44._0_32_;
          auVar32 = auVar43._0_32_;
          auVar23 = auVar38._0_32_;
          if ((uVar19 & 8) == 0) {
            auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar14),auVar42._0_32_,
                                     auVar39._0_32_);
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar15),auVar23,
                                     auVar40._0_32_);
            auVar28 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar5));
            auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar16),auVar32,
                                     auVar41._0_32_);
            auVar6 = vpmaxsd_avx2(ZEXT1632(auVar4),auVar37);
            auVar24 = vpmaxsd_avx512vl(auVar28,auVar6);
            in_ZMM18 = ZEXT3264(auVar24);
            auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar12),auVar42._0_32_,
                                     auVar39._0_32_);
            auVar5 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar18),auVar23,
                                     auVar40._0_32_);
            auVar28 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar5));
            auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar19 + 0x40 + uVar17),auVar32,
                                     auVar41._0_32_);
            auVar6 = vpminsd_avx2(ZEXT1632(auVar4),auVar33._0_32_);
            auVar28 = vpminsd_avx2(auVar28,auVar6);
            uVar35 = vpcmpd_avx512vl(auVar24,auVar28,2);
            unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar35);
          }
          if ((uVar19 & 8) == 0) {
            if (unaff_R14 == 0) {
              iVar10 = 4;
            }
            else {
              auVar28 = *(undefined1 (*) [32])(uVar19 & 0xfffffffffffffff0);
              auVar6 = ((undefined1 (*) [32])(uVar19 & 0xfffffffffffffff0))[1];
              auVar24 = vmovdqa64_avx512vl(auVar45._0_32_);
              auVar47 = in_ZMM18._0_32_;
              auVar24 = vpternlogd_avx512vl(auVar24,auVar47,auVar46._0_32_,0xf8);
              uVar19 = unaff_R14 & 0xffffffff;
              auVar25 = vpcompressd_avx512vl(auVar24);
              bVar3 = (bool)((byte)uVar19 & 1);
              auVar27._0_4_ = (uint)bVar3 * auVar25._0_4_ | (uint)!bVar3 * auVar24._0_4_;
              bVar3 = (bool)((byte)(uVar19 >> 1) & 1);
              auVar27._4_4_ = (uint)bVar3 * auVar25._4_4_ | (uint)!bVar3 * auVar24._4_4_;
              bVar3 = (bool)((byte)(uVar19 >> 2) & 1);
              auVar27._8_4_ = (uint)bVar3 * auVar25._8_4_ | (uint)!bVar3 * auVar24._8_4_;
              bVar3 = (bool)((byte)(uVar19 >> 3) & 1);
              auVar27._12_4_ = (uint)bVar3 * auVar25._12_4_ | (uint)!bVar3 * auVar24._12_4_;
              bVar3 = (bool)((byte)(uVar19 >> 4) & 1);
              auVar27._16_4_ = (uint)bVar3 * auVar25._16_4_ | (uint)!bVar3 * auVar24._16_4_;
              bVar3 = (bool)((byte)(uVar19 >> 5) & 1);
              auVar27._20_4_ = (uint)bVar3 * auVar25._20_4_ | (uint)!bVar3 * auVar24._20_4_;
              bVar3 = (bool)((byte)(uVar19 >> 6) & 1);
              auVar27._24_4_ = (uint)bVar3 * auVar25._24_4_ | (uint)!bVar3 * auVar24._24_4_;
              bVar3 = (bool)((byte)(uVar19 >> 7) & 1);
              auVar27._28_4_ = (uint)bVar3 * auVar25._28_4_ | (uint)!bVar3 * auVar24._28_4_;
              auVar24 = vpermt2q_avx512vl(auVar28,auVar27,auVar6);
              uVar19 = auVar24._0_8_;
              iVar10 = 0;
              uVar11 = unaff_R14 - 1 & unaff_R14;
              if (uVar11 != 0) {
                auVar24 = vpshufd_avx2(auVar27,0x55);
                vpermt2q_avx512vl(auVar28,auVar24,auVar6);
                auVar25 = vpminsd_avx2(auVar27,auVar24);
                auVar24 = vpmaxsd_avx2(auVar27,auVar24);
                uVar11 = uVar11 - 1 & uVar11;
                if (uVar11 == 0) {
                  auVar23 = vpermi2q_avx512vl(auVar25,auVar28,auVar6);
                  uVar19 = auVar23._0_8_;
                  auVar23 = vpermt2q_avx512vl(auVar28,auVar24,auVar6);
                  *local_2480 = auVar23._0_8_;
                  auVar23 = vpermd_avx512vl(auVar24,auVar47);
                  *(int *)(local_2480 + 1) = auVar23._0_4_;
                  local_2480 = local_2480 + 2;
                }
                else {
                  auVar8 = vpshufd_avx2(auVar27,0xaa);
                  vpermt2q_avx512vl(auVar28,auVar8,auVar6);
                  auVar7 = vpminsd_avx2(auVar25,auVar8);
                  auVar25 = vpmaxsd_avx2(auVar25,auVar8);
                  auVar8 = vpminsd_avx2(auVar24,auVar25);
                  auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                  uVar11 = uVar11 - 1 & uVar11;
                  if (uVar11 == 0) {
                    auVar23 = vpermi2q_avx512vl(auVar7,auVar28,auVar6);
                    uVar19 = auVar23._0_8_;
                    auVar23 = vpermt2q_avx512vl(auVar28,auVar24,auVar6);
                    *local_2480 = auVar23._0_8_;
                    auVar23 = vpermd_avx512vl(auVar24,auVar47);
                    *(int *)(local_2480 + 1) = auVar23._0_4_;
                    auVar23 = vpermt2q_avx512vl(auVar28,auVar8,auVar6);
                    local_2480[2] = auVar23._0_8_;
                    auVar23 = vpermd_avx512vl(auVar8,auVar47);
                    *(int *)(local_2480 + 3) = auVar23._0_4_;
                    local_2480 = local_2480 + 4;
                  }
                  else {
                    auVar26 = vmovdqa64_avx512vl(auVar47);
                    auVar25 = vpshufd_avx2(auVar27,0xff);
                    vpermt2q_avx512vl(auVar28,auVar25,auVar6);
                    auVar47 = vpminsd_avx2(auVar7,auVar25);
                    auVar25 = vpmaxsd_avx2(auVar7,auVar25);
                    auVar7 = vpminsd_avx2(auVar8,auVar25);
                    auVar25 = vpmaxsd_avx2(auVar8,auVar25);
                    auVar8 = vpminsd_avx2(auVar24,auVar25);
                    auVar24 = vpmaxsd_avx2(auVar24,auVar25);
                    uVar11 = uVar11 - 1 & uVar11;
                    iVar10 = 0;
                    if (uVar11 == 0) {
                      auVar27 = vpermi2q_avx512vl(auVar47,auVar28,auVar6);
                      uVar19 = auVar27._0_8_;
                      auVar27 = vpermt2q_avx512vl(auVar28,auVar24,auVar6);
                      *local_2480 = auVar27._0_8_;
                      auVar27 = vmovdqa64_avx512vl(auVar26);
                      in_ZMM18 = ZEXT3264(auVar27);
                      auVar24 = vpermd_avx512vl(auVar24,auVar26);
                      *(int *)(local_2480 + 1) = auVar24._0_4_;
                      auVar24 = vpermt2q_avx512vl(auVar28,auVar8,auVar6);
                      local_2480[2] = auVar24._0_8_;
                      auVar24 = vpermd_avx512vl(auVar8,auVar26);
                      *(int *)(local_2480 + 3) = auVar24._0_4_;
                      auVar28 = vpermt2q_avx512vl(auVar28,auVar7,auVar6);
                      local_2480[4] = auVar28._0_8_;
                      auVar28 = vpermd_avx512vl(auVar7,auVar26);
                      *(int *)(local_2480 + 5) = auVar28._0_4_;
                      local_2480 = local_2480 + 6;
                      auVar38 = ZEXT3264(auVar23);
                      auVar43 = ZEXT3264(auVar32);
                      auVar44 = ZEXT3264(auVar37);
                    }
                    else {
                      auVar29 = valignd_avx512vl(auVar27,auVar27,3);
                      auVar27 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                      auVar25 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                     CONCAT48(0x80000000,
                                                                              0x8000000080000000))),
                                                  auVar27,auVar47);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                      auVar25 = vpermt2d_avx512vl(auVar25,auVar27,auVar7);
                      auVar25 = vpermt2d_avx512vl(auVar25,auVar27,auVar8);
                      auVar27 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                      auVar24 = vpermt2d_avx512vl(auVar25,auVar27,auVar24);
                      auVar38 = ZEXT3264(auVar24);
                      uVar19 = uVar11;
                      do {
                        auVar27 = auVar38._0_32_;
                        auVar24._8_4_ = 1;
                        auVar24._0_8_ = 0x100000001;
                        auVar24._12_4_ = 1;
                        auVar24._16_4_ = 1;
                        auVar24._20_4_ = 1;
                        auVar24._24_4_ = 1;
                        auVar24._28_4_ = 1;
                        auVar24 = vpermd_avx2(auVar24,auVar29);
                        auVar29 = valignd_avx512vl(auVar29,auVar29,1);
                        vpermt2q_avx512vl(auVar28,auVar29,auVar6);
                        uVar19 = uVar19 - 1 & uVar19;
                        uVar35 = vpcmpd_avx512vl(auVar24,auVar27,5);
                        auVar24 = vpmaxsd_avx2(auVar24,auVar27);
                        bVar9 = (byte)uVar35 << 1;
                        auVar27 = valignd_avx512vl(auVar27,auVar27,7);
                        bVar3 = (bool)((byte)uVar35 & 1);
                        auVar25._4_4_ = (uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * auVar24._4_4_;
                        auVar25._0_4_ = auVar24._0_4_;
                        bVar3 = (bool)(bVar9 >> 2 & 1);
                        auVar25._8_4_ = (uint)bVar3 * auVar27._8_4_ | (uint)!bVar3 * auVar24._8_4_;
                        bVar3 = (bool)(bVar9 >> 3 & 1);
                        auVar25._12_4_ =
                             (uint)bVar3 * auVar27._12_4_ | (uint)!bVar3 * auVar24._12_4_;
                        bVar3 = (bool)(bVar9 >> 4 & 1);
                        auVar25._16_4_ =
                             (uint)bVar3 * auVar27._16_4_ | (uint)!bVar3 * auVar24._16_4_;
                        bVar3 = (bool)(bVar9 >> 5 & 1);
                        auVar25._20_4_ =
                             (uint)bVar3 * auVar27._20_4_ | (uint)!bVar3 * auVar24._20_4_;
                        bVar3 = (bool)(bVar9 >> 6 & 1);
                        auVar25._24_4_ =
                             (uint)bVar3 * auVar27._24_4_ | (uint)!bVar3 * auVar24._24_4_;
                        auVar25._28_4_ =
                             (uint)(bVar9 >> 7) * auVar27._28_4_ |
                             (uint)!(bool)(bVar9 >> 7) * auVar24._28_4_;
                        auVar38 = ZEXT3264(auVar25);
                      } while (uVar19 != 0);
                      lVar13 = POPCOUNT(uVar11) + 3;
                      do {
                        auVar24 = vpermi2q_avx512vl(auVar25,auVar28,auVar6);
                        *local_2480 = auVar24._0_8_;
                        auVar27 = auVar38._0_32_;
                        auVar24 = vpermd_avx512vl(auVar27,auVar26);
                        *(int *)(local_2480 + 1) = auVar24._0_4_;
                        auVar25 = valignd_avx512vl(auVar27,auVar27,1);
                        local_2480 = local_2480 + 2;
                        auVar38 = ZEXT3264(auVar25);
                        lVar13 = lVar13 + -1;
                      } while (lVar13 != 0);
                      auVar28 = vpermt2q_avx512vl(auVar28,auVar25,auVar6);
                      uVar19 = auVar28._0_8_;
                      auVar38 = ZEXT3264(auVar23);
                      auVar43 = ZEXT3264(auVar32);
                      auVar44 = ZEXT3264(auVar37);
                      auVar23 = vmovdqa64_avx512vl(auVar26);
                      in_ZMM18 = ZEXT3264(auVar23);
                    }
                  }
                }
              }
            }
          }
          else {
            iVar10 = 6;
          }
        } while (iVar10 == 0);
        if (iVar10 == 6) {
          local_2398 = vmovdqu64_avx512vl(in_ZMM18._0_32_);
          lVar13 = (ulong)((uint)uVar19 & 0xf) - 8;
          if (lVar13 != 0) {
            prim = (Primitive *)(uVar19 & 0xfffffffffffffff0);
            do {
              InstanceArrayIntersector1::intersect(&local_24a9,ray,context,prim);
              prim = prim + 1;
              lVar13 = lVar13 + -1;
            } while (lVar13 != 0);
          }
          fVar30 = (ray->super_RayK<1>).tfar;
          auVar33 = ZEXT3264(CONCAT428(fVar30,CONCAT424(fVar30,CONCAT420(fVar30,CONCAT416(fVar30,
                                                  CONCAT412(fVar30,CONCAT48(fVar30,CONCAT44(fVar30,
                                                  fVar30))))))));
          auVar39 = ZEXT3264(local_23b8);
          auVar40 = ZEXT3264(local_23d8);
          auVar41 = ZEXT3264(local_23f8);
          auVar42 = ZEXT3264(local_2418);
          auVar38 = ZEXT3264(local_2438);
          auVar43 = ZEXT3264(local_2458);
          auVar44 = ZEXT3264(local_2478);
          auVar23 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
          auVar45 = ZEXT3264(auVar23);
          auVar23 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
          auVar46 = ZEXT3264(auVar23);
          auVar23 = vmovdqu64_avx512vl(local_2398);
          in_ZMM18 = ZEXT3264(auVar23);
          uVar12 = local_24a0;
          uVar14 = local_2488;
          uVar15 = local_2490;
          uVar16 = local_2498;
          uVar18 = local_24a8;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }